

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pack.hpp
# Opt level: O2

void HAXX::
     TPACK<2ul,HAXX::quaternion<double>,HAXX::GenericPackOps_T1<HAXX::quaternion<double>,HAXX::AVXType<double>>,std::complex<double>>
               (int32_t M,int32_t N,quaternion<double> *X,int32_t LDX,quaternion<double> *Xp,
               complex<double> args)

{
  undefined1 auVar1 [32];
  undefined1 auVar2 [16];
  quaternion<double> *pqVar3;
  uint uVar4;
  undefined1 in_ZMM0 [64];
  undefined1 in_ZMM1 [64];
  anon_class_1_0_00000001 store;
  anon_class_1_0_00000001 ptrInc;
  int32_t i;
  anon_class_40_5_4bfda206 loopBody;
  type load_preOP;
  complex_t alpha;
  undefined1 local_fe;
  undefined1 local_fd;
  uint local_fc;
  quaternion<double> *local_f8;
  tuple<HAXX::quaternion<double>_*,_HAXX::quaternion<double>_*> local_f0;
  undefined1 local_e0 [4];
  int32_t local_dc;
  undefined1 *local_d8;
  int32_t *local_d0;
  undefined1 **local_c8;
  undefined1 *local_c0;
  undefined1 *local_b8;
  undefined1 *local_b0;
  undefined1 *local_a8;
  undefined1 local_a0 [32];
  undefined8 local_80;
  ulong uStack_78;
  undefined8 uStack_70;
  ulong uStack_68;
  
  auVar2 = vunpcklpd_avx(in_ZMM0._0_16_,in_ZMM1._0_16_);
  local_d0 = &local_dc;
  local_b0 = local_a0;
  local_c8 = &local_b0;
  local_a0._16_16_ = auVar2;
  local_a0._0_16_ = auVar2;
  local_d8 = local_e0;
  local_c0 = &local_fe;
  auVar1 = vshufpd_avx(local_a0,local_a0,5);
  local_80 = auVar1._0_8_;
  uStack_78 = auVar1._8_8_ ^ 0x8000000000000000;
  uStack_70 = auVar1._16_8_;
  uStack_68 = auVar1._24_8_ ^ 0x8000000000000000;
  local_b8 = &local_fd;
  local_fc = N;
  local_f8 = Xp;
  local_dc = M;
  local_a8 = local_b0;
  if (0 < N >> 1) {
    uVar4 = (N >> 1) + 1;
    pqVar3 = X;
    do {
      local_f0.super__Tuple_impl<0UL,_HAXX::quaternion<double>_*,_HAXX::quaternion<double>_*>.
      super__Tuple_impl<1UL,_HAXX::quaternion<double>_*>.
      super__Head_base<1UL,_HAXX::quaternion<double>_*,_false>._M_head_impl =
           (_Head_base<1UL,_HAXX::quaternion<double>_*,_false>)(pqVar3 + LDX);
      X = pqVar3 + (long)LDX * 2;
      local_f0.super__Tuple_impl<0UL,_HAXX::quaternion<double>_*,_HAXX::quaternion<double>_*>.
      super__Head_base<0UL,_HAXX::quaternion<double>_*,_false>._M_head_impl = pqVar3;
      TPACK<2ul,HAXX::quaternion<double>,HAXX::GenericPackOps_T1<HAXX::quaternion<double>,HAXX::AVXType<double>>,std::complex<double>>(int,int,HAXX::quaternion<double>*,int,HAXX::quaternion<double>*,std::complex<double>)
      ::{lambda(auto:1&,auto:2*&)#1}::operator()(&local_d8,&local_f0,&local_f8);
      uVar4 = uVar4 - 1;
      pqVar3 = X;
    } while (1 < uVar4);
  }
  if ((local_fc & 1) != 0) {
    local_f0.super__Tuple_impl<0UL,_HAXX::quaternion<double>_*,_HAXX::quaternion<double>_*>.
    super__Tuple_impl<1UL,_HAXX::quaternion<double>_*>.
    super__Head_base<1UL,_HAXX::quaternion<double>_*,_false>._M_head_impl =
         (_Head_base<1UL,_HAXX::quaternion<double>_*,_false>)
         (_Head_base<1UL,_HAXX::quaternion<double>_*,_false>)X;
    TPACK<2ul,HAXX::quaternion<double>,HAXX::GenericPackOps_T1<HAXX::quaternion<double>,HAXX::AVXType<double>>,std::complex<double>>(int,int,HAXX::quaternion<double>*,int,HAXX::quaternion<double>*,std::complex<double>)
    ::{lambda(auto:1&,auto:2*&)#1}::operator()
              (&local_d8,(tuple<HAXX::quaternion<double>_*> *)&local_f0,&local_f8);
  }
  return;
}

Assistant:

void TPACK(const HAXX_INT M, const HAXX_INT N, T *X,
    const HAXX_INT LDX, T *Xp, Args... args) {
  
  
    // Sanity Checks
      

    static_assert( PK > 0, "Packing dimension must be non-zero" );      

    static_assert(
      (sizeof(typename PackOps::load_t) % sizeof(T)) == 0,
      "The size of the loaded variable must be an integer multiple of T" 
    );

    constexpr size_t NLOAD = sizeof(typename PackOps::load_t) / sizeof(T);

    static_assert(
      ( PK % NLOAD ) == 0,
      "The packing dimension must be an integer multiple of NLOAD"
    );

  
  
    HAXX_INT i,j;
  
  
    T *_x,*_x1,*_x2;
    T *_xp;
    
  
    _x  = X;
    _xp = Xp;
  
    auto alpha = PackOps::TypeWrapper::LoadScalar(args...);
  
  
    auto load_preOP = 
      overload(
        [&](auto &t){ 
          auto x = PackOps::TypeWrapper::Load(t);        
          return PackOps::preOP(x,alpha);
        },
        [&](){ 
          auto x = PackOps::TypeWrapper::Load();        
          return PackOps::preOP(x,alpha);
        }
      );
  
    auto ptrInc = [](auto &t){ return t + 1; };
  
    auto store = [](auto *&p, auto &t){ PackOps::TypeWrapper::Store(p,t);    };

    auto loopBody = [&](auto &xCol, auto *&xp) {

      for( i = 0; i < M; i++ ) {
  
        auto x   = apply_n<PK>( load_preOP, xCol );
        auto x_t = PackOps::OP(x);
  
        array_tuple_execute( store, xp, x_t );
  
        xCol = apply( ptrInc, xCol );
        xp += PK;
  
      }

    };
  
    j = N / PK;
    if( j > 0 )
    do {
  
      auto xCol = pointer_sequence<PK>(_x,LDX);
      _x += PK*LDX;

      loopBody(xCol,_xp);
      
      j--;
  
    } while(j > 0);
  

    j = N % PK;
    if( j ) {
  
      #ifdef _NDEBUG
        #undef _NDEBUG
        assert(j == 1 /* This has yet to be worked out */);
        #define _NDEBUG
      #else
        assert(j == 1 /* This has yet to be worked out */);
      #endif
  
      auto xCol = std::make_tuple(_x);
      loopBody(xCol,_xp);

    }
  
  }